

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

int Gia_ManArePrintListUsed(Gia_ManAre_t *p,Gia_PtrAre_t Root)

{
  uint **ppuVar1;
  Gia_StaAre_t *pSta;
  
  ppuVar1 = p->ppStas;
  pSta = (Gia_StaAre_t *)
         ((long)p->nSize * (ulong)((uint)Root & 0xfffff) * 4 +
         *(long *)((long)ppuVar1 + (ulong)((uint)Root >> 0x11 & 0x3ff8)));
  if ((Gia_StaAre_t *)*ppuVar1 != pSta) {
    do {
      if (-1 < (int)pSta->iPrev) {
        Gia_ManArePrintCube(p,pSta);
      }
      ppuVar1 = (uint **)(ulong)((uint)pSta->iNext & 0xfffff);
      pSta = (Gia_StaAre_t *)
             ((long)p->nSize * (long)ppuVar1 * 4 +
             *(long *)((long)p->ppStas + (ulong)((uint)pSta->iNext >> 0x11 & 0x3ff8)));
    } while ((Gia_StaAre_t *)*p->ppStas != pSta);
  }
  return (int)ppuVar1;
}

Assistant:

static inline int Gia_ManArePrintListUsed( Gia_ManAre_t * p, Gia_PtrAre_t Root )
{
    Gia_StaAre_t * pCube;
    Gia_ManAreForEachCubeList( p, Gia_ManAreSta(p, Root), pCube )
        if ( Gia_StaIsUsed(pCube) )
            Gia_ManArePrintCube( p, pCube );
    return 1;
}